

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manager.h
# Opt level: O3

void __thiscall Manager::Manager(Manager *this,int bRow,int bColumn,int Games)

{
  undefined8 *puVar1;
  pointer pBVar2;
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_90;
  Board local_78;
  int local_38;
  int local_34;
  
  (this->puzzles).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->puzzles).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->puzzles).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_38 = bColumn;
  local_34 = bRow;
  std::vector<Board,_std::allocator<Board>_>::resize(&this->puzzles,(long)Games);
  if ((this->puzzles).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->puzzles).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar5 = 0x30;
    uVar6 = 0;
    do {
      Board::Board(&local_78,local_34,local_38);
      pBVar2 = (this->puzzles).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
               super__Vector_impl_data._M_start;
      pvVar3 = *(void **)((long)pBVar2 + lVar5 + -0x30);
      *(pointer *)((long)pBVar2 + lVar5 + -0x30) =
           local_78.armada.super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
           super__Vector_impl_data._M_start;
      *(pointer *)((long)pBVar2 + lVar5 + -0x28) =
           local_78.armada.super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
           super__Vector_impl_data._M_finish;
      *(pointer *)((long)pBVar2 + lVar5 + -0x20) =
           local_78.armada.super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_78.armada.super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.armada.super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.armada.super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3);
      }
      *(undefined8 *)((long)pBVar2 + lVar5 + -0x18) = local_78._24_8_;
      puVar1 = (undefined8 *)((long)pBVar2 + lVar5 + -0x10);
      local_90.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)*puVar1;
      local_90.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar1[1];
      local_90.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           *(pointer *)
            ((long)&(pBVar2->armada).super__Vector_base<Ship,_std::allocator<Ship>_> + lVar5);
      *(pointer *)((long)pBVar2 + lVar5 + -0x10) =
           local_78.matrix.
           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)((long)pBVar2 + lVar5 + -8) =
           local_78.matrix.
           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)((long)&(pBVar2->armada).super__Vector_base<Ship,_std::allocator<Ship>_> + lVar5)
           = local_78.matrix.
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_78.matrix.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.matrix.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.matrix.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector(&local_90);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector(&local_78.matrix);
      if (local_78.armada.super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.armada.super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar6 = uVar6 + 1;
      uVar4 = ((long)(this->puzzles).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->puzzles).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
      lVar5 = lVar5 + 0x38;
    } while (uVar6 <= uVar4 && uVar4 - uVar6 != 0);
  }
  return;
}

Assistant:

Manager( int bRow, int bColumn, int Games )
        {

            // "allocating" the vector of vectors using the method resize()
            puzzles.resize( Games );

           for( int i = 0; i < puzzles.size(); i++ )
           {
              puzzles[i] = Board( bRow, bColumn );
           }

        }